

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O2

void poly1305_donna::poly1305_blocks(poly1305_context *st,uchar *m,size_t bytes)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t uVar15;
  ulong uVar16;
  ulong uVar17;
  uint32_t uVar18;
  ulong uVar19;
  ulong uVar20;
  uint32_t uVar21;
  ulong uVar22;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (ulong)st->r[0];
  uVar5 = (ulong)st->r[1];
  uVar9 = (ulong)st->r[2];
  uVar1 = st->r[3];
  uVar6 = (ulong)(st->r[2] * 5);
  uVar7 = (ulong)(uVar1 * 5);
  uVar8 = (ulong)(st->r[4] * 5);
  uVar3 = st->h[0];
  uVar11 = st->h[1];
  uVar18 = st->h[2];
  uVar21 = st->h[3];
  uVar15 = st->h[4];
  for (; 0xf < bytes; bytes = bytes - 0x10) {
    uVar20 = (ulong)((*(uint *)m & 0x3ffffff) + uVar3);
    uVar13 = (ulong)((*(uint *)((long)m + 3) >> 2 & 0x3ffffff) + uVar11);
    uVar17 = (ulong)((*(uint *)((long)m + 6) >> 4 & 0x3ffffff) + uVar18);
    uVar16 = (ulong)((*(uint *)((long)m + 9) >> 6) + uVar21);
    uVar10 = (ulong)(uVar15 + (uint)(st->final == '\0') * 0x1000000 +
                    (*(uint *)((long)m + 0xc) >> 8));
    uVar12 = uVar10 * (st->r[1] * 5) +
             uVar16 * uVar6 + uVar17 * uVar7 + uVar13 * uVar8 + uVar20 * uVar4;
    uVar14 = (uVar12 >> 0x1a & 0xffffffff) +
             uVar10 * uVar6 + uVar16 * uVar7 + uVar17 * uVar8 + uVar13 * uVar4 + uVar20 * uVar5;
    uVar19 = (uVar14 >> 0x1a & 0xffffffff) +
             uVar10 * uVar7 + uVar16 * uVar8 + uVar17 * uVar4 + uVar13 * uVar5 + uVar20 * uVar9;
    uVar22 = (uVar19 >> 0x1a & 0xffffffff) +
             uVar10 * uVar8 + uVar16 * uVar4 + uVar17 * uVar5 + uVar13 * uVar9 + uVar20 * uVar1;
    uVar17 = (uVar22 >> 0x1a & 0xffffffff) +
             uVar10 * uVar4 + uVar16 * uVar5 + uVar17 * uVar9 + uVar13 * uVar1 + uVar20 * st->r[4];
    uVar3 = (int)(uVar17 >> 0x1a) * 5 + ((uint)uVar12 & 0x3ffffff);
    uVar11 = (uVar3 >> 0x1a) + ((uint)uVar14 & 0x3ffffff);
    uVar18 = (uint)uVar19 & 0x3ffffff;
    uVar21 = (uint)uVar22 & 0x3ffffff;
    uVar15 = (uint)uVar17 & 0x3ffffff;
    uVar3 = uVar3 & 0x3ffffff;
    m = (uchar *)((long)m + 0x10);
  }
  st->h[0] = uVar3;
  st->h[1] = uVar11;
  st->h[2] = uVar18;
  st->h[3] = uVar21;
  st->h[4] = uVar15;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void poly1305_blocks(poly1305_context *st, const unsigned char *m, size_t bytes) noexcept {
    const uint32_t hibit = (st->final) ? 0 : (1UL << 24); /* 1 << 128 */
    uint32_t r0,r1,r2,r3,r4;
    uint32_t s1,s2,s3,s4;
    uint32_t h0,h1,h2,h3,h4;
    uint64_t d0,d1,d2,d3,d4;
    uint32_t c;

    r0 = st->r[0];
    r1 = st->r[1];
    r2 = st->r[2];
    r3 = st->r[3];
    r4 = st->r[4];

    s1 = r1 * 5;
    s2 = r2 * 5;
    s3 = r3 * 5;
    s4 = r4 * 5;

    h0 = st->h[0];
    h1 = st->h[1];
    h2 = st->h[2];
    h3 = st->h[3];
    h4 = st->h[4];

    while (bytes >= POLY1305_BLOCK_SIZE) {
        /* h += m[i] */
        h0 += (ReadLE32(m+ 0)     ) & 0x3ffffff;
        h1 += (ReadLE32(m+ 3) >> 2) & 0x3ffffff;
        h2 += (ReadLE32(m+ 6) >> 4) & 0x3ffffff;
        h3 += (ReadLE32(m+ 9) >> 6) & 0x3ffffff;
        h4 += (ReadLE32(m+12) >> 8) | hibit;

        /* h *= r */
        d0 = ((uint64_t)h0 * r0) + ((uint64_t)h1 * s4) + ((uint64_t)h2 * s3) + ((uint64_t)h3 * s2) + ((uint64_t)h4 * s1);
        d1 = ((uint64_t)h0 * r1) + ((uint64_t)h1 * r0) + ((uint64_t)h2 * s4) + ((uint64_t)h3 * s3) + ((uint64_t)h4 * s2);
        d2 = ((uint64_t)h0 * r2) + ((uint64_t)h1 * r1) + ((uint64_t)h2 * r0) + ((uint64_t)h3 * s4) + ((uint64_t)h4 * s3);
        d3 = ((uint64_t)h0 * r3) + ((uint64_t)h1 * r2) + ((uint64_t)h2 * r1) + ((uint64_t)h3 * r0) + ((uint64_t)h4 * s4);
        d4 = ((uint64_t)h0 * r4) + ((uint64_t)h1 * r3) + ((uint64_t)h2 * r2) + ((uint64_t)h3 * r1) + ((uint64_t)h4 * r0);

        /* (partial) h %= p */
                      c = (uint32_t)(d0 >> 26); h0 = (uint32_t)d0 & 0x3ffffff;
        d1 += c;      c = (uint32_t)(d1 >> 26); h1 = (uint32_t)d1 & 0x3ffffff;
        d2 += c;      c = (uint32_t)(d2 >> 26); h2 = (uint32_t)d2 & 0x3ffffff;
        d3 += c;      c = (uint32_t)(d3 >> 26); h3 = (uint32_t)d3 & 0x3ffffff;
        d4 += c;      c = (uint32_t)(d4 >> 26); h4 = (uint32_t)d4 & 0x3ffffff;
        h0 += c * 5;  c =           (h0 >> 26); h0 =           h0 & 0x3ffffff;
        h1 += c;

        m += POLY1305_BLOCK_SIZE;
        bytes -= POLY1305_BLOCK_SIZE;
    }

    st->h[0] = h0;
    st->h[1] = h1;
    st->h[2] = h2;
    st->h[3] = h3;
    st->h[4] = h4;
}